

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::SetupProperties(MDLImporter *this,Importer *pImp)

{
  Importer *this_00;
  uint uVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  Importer *local_18;
  Importer *pImp_local;
  MDLImporter *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_KEYFRAME",-1);
  this->configFrameID = uVar1;
  if (this->configFrameID == 0xffffffff) {
    uVar1 = Importer::GetPropertyInteger(local_18,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar1;
  }
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"colormap.lmp",&local_59);
  Importer::GetPropertyString(&local_38,this_00,"IMPORT_MDL_COLORMAP",&local_58);
  std::__cxx11::string::operator=((string *)&this->configPalette,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

void MDLImporter::SetupProperties(const Importer* pImp)
{
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MDL_KEYFRAME,-1);

    // The
    // AI_CONFIG_IMPORT_MDL_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    if(static_cast<unsigned int>(-1) == configFrameID)  {
        configFrameID =  pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    // AI_CONFIG_IMPORT_MDL_COLORMAP - palette file
    configPalette =  pImp->GetPropertyString(AI_CONFIG_IMPORT_MDL_COLORMAP,"colormap.lmp");
}